

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManReader.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::DataManReader::DoGetSync
          (DataManReader *this,Variable<unsigned_long> *variable,uint64_t *data)

{
  DataManReader *this_00;
  long in_RSI;
  long in_RDI;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff2c;
  allocator local_99;
  string local_98 [8];
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  string *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa8;
  LogMode in_stack_ffffffffffffffb0;
  allocator local_39;
  string local_38 [40];
  long local_10;
  
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"Engine",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff90,"DataManReader",
             (allocator *)&stack0xffffffffffffff8f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"GetSync",&local_99);
  this_00 = (DataManReader *)(local_10 + 8);
  helper::Comm::Rank((Comm *)0xe1aa06);
  uVar1 = *(undefined4 *)(in_RDI + 0xe8);
  uVar2 = 0x69;
  helper::Log(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
              in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,
              in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff8f);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  GetSyncCommon<unsigned_long>
            (this_00,(Variable<unsigned_long> *)CONCAT44(in_stack_ffffffffffffff2c,uVar2),
             (unsigned_long *)CONCAT44(in_stack_ffffffffffffff24,uVar1));
  return;
}

Assistant:

void DataManReader::DoClose(const int transportIndex)
{
    m_SubscriberThreadActive = false;
    m_RequesterThreadActive = false;
    if (m_SubscriberThread.joinable())
    {
        m_SubscriberThread.join();
    }
    if (m_RequesterThread.joinable())
    {
        m_RequesterThread.join();
    }
    m_IsClosed = true;
    if (m_MonitorActive)
    {
        m_Monitor.OutputCsv(m_Name);
        m_Monitor.OutputJson(m_Name);
    }
}